

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool duckdb::DBConfig::IsInMemoryDatabase(char *database_path)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((database_path != (char *)0x0) && (*database_path != '\0')) {
    iVar1 = strcmp(database_path,":memory:");
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool DBConfig::IsInMemoryDatabase(const char *database_path) {
	if (!database_path) {
		// Entirely empty
		return true;
	}
	if (strlen(database_path) == 0) {
		// '' empty string
		return true;
	}
	if (strcmp(database_path, ":memory:") == 0) {
		return true;
	}
	return false;
}